

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  randomx_flags rVar1;
  ostream *poVar2;
  randomx_argon2_impl *prVar3;
  runtime_error *prVar4;
  undefined8 *puVar5;
  unsigned_long uVar6;
  randomx_cache *prVar7;
  randomx_dataset *dataset_00;
  ulong uVar8;
  size_type sVar9;
  reference pprVar10;
  atomic<unsigned_int> *paVar11;
  AtomicHash *pAVar12;
  Instruction in_RSI;
  char *pcVar13;
  double dVar14;
  MemoryException *e;
  exception *e_1;
  uint i_5;
  double elapsed;
  uint i_4;
  int cpuid;
  uint i_3;
  randomx_vm *vm;
  int i_2;
  uint i_1;
  uint32_t count;
  int i;
  uint32_t startItem;
  uint32_t remainder;
  uint32_t perThread;
  uint32_t datasetItemCount;
  Stopwatch sw;
  MineFunc *func;
  randomx_flags flags;
  randomx_cache *cache;
  randomx_dataset *dataset;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> vms;
  AtomicHash result;
  atomic<unsigned_int> atomicNonce;
  char seed [4];
  int32_t seedValue;
  uint64_t threadAffinity;
  int initThreadCount;
  int threadCount;
  int noncesCount;
  bool noBatch;
  bool autoFlags;
  bool avx2;
  bool ssse3;
  bool commit;
  bool secure;
  bool jit;
  bool largePages;
  bool help;
  bool verificationMode;
  bool miningMode;
  bool softAes;
  AtomicHash *in_stack_fffffffffffffbe8;
  randomx_cache *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffbfc;
  randomx_dataset *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  int argc_00;
  AtomicHash *in_stack_fffffffffffffc10;
  uint *in_stack_fffffffffffffc18;
  uint *in_stack_fffffffffffffc20;
  randomx_cache **in_stack_fffffffffffffc28;
  randomx_cache *in_stack_fffffffffffffc30;
  reference_wrapper<std::atomic<unsigned_int>_> *in_stack_fffffffffffffc38;
  thread *in_stack_fffffffffffffc40;
  _func_void_randomx_vm_ptr_atomic<unsigned_int>_ptr_AtomicHash_ptr_uint_int_int
  **in_stack_fffffffffffffc48;
  thread *in_stack_fffffffffffffc50;
  value_type prVar15;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  undefined4 uVar16;
  int *in_stack_fffffffffffffc68;
  Instruction IVar17;
  randomx_cache *in_stack_fffffffffffffd38;
  uint local_2c0;
  randomx_flags in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  uint local_174;
  uint local_154;
  undefined1 local_138 [8];
  randomx_vm *local_130;
  int local_128;
  uint local_124;
  code *local_120;
  int local_110;
  uint32_t local_10c;
  int local_108;
  uint local_104;
  randomx_flags local_100;
  uint local_fc;
  Instruction local_e0;
  string local_d8 [52];
  randomx_flags local_a4;
  Instruction local_a0;
  Instruction local_98;
  vector<std::thread,_std::allocator<std::thread>_> local_90;
  vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> local_78 [2];
  undefined1 local_3c [4];
  undefined1 local_38 [4];
  uint32_t local_34;
  Instruction local_30;
  uint local_28;
  uint32_t local_24;
  int local_20;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  byte local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  byte local_14;
  byte local_13;
  byte local_12;
  byte local_11;
  Instruction local_10;
  uint32_t local_4;
  
  argc_00 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
  local_4 = 0;
  local_10 = in_RSI;
  readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  readIntOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
                (char **)in_stack_fffffffffffffbf0,(int *)in_stack_fffffffffffffbe8,0);
  readUInt64Option((char *)in_stack_fffffffffffffc10,argc_00,(char **)in_stack_fffffffffffffc00,
                   (uint64_t *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                   (uint64_t)in_stack_fffffffffffffbf0);
  readIntOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
                (char **)in_stack_fffffffffffffbf0,(int *)in_stack_fffffffffffffbe8,0);
  readIntOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
                (char **)in_stack_fffffffffffffbf0,(int *)in_stack_fffffffffffffbe8,0);
  readIntOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
                (char **)in_stack_fffffffffffffbf0,(int *)in_stack_fffffffffffffbe8,0);
  readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  if ((local_15 & 1) == 0) {
    readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
               (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  }
  readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  readOption((char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char **)in_stack_fffffffffffffbf0,(bool *)in_stack_fffffffffffffbe8);
  store32(local_38,local_34);
  poVar2 = std::operator<<((ostream *)&std::cout,"RandomX benchmark v1.2.1");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if ((local_14 & 1) == 0) {
    if (((local_12 & 1) == 0) && ((local_13 & 1) == 0)) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "Please select either the fast mode (--mine) or the slow mode (--verify)"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"Run \'");
      poVar2 = std::operator<<(poVar2,*(char **)local_10);
      poVar2 = std::operator<<(poVar2," --help\' to see all supported options");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
    }
    else {
      memset(local_3c,0,4);
      AtomicHash::AtomicHash(in_stack_fffffffffffffc10);
      std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::vector
                ((vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> *)0x108c17);
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)0x108c24);
      if ((local_1b & 1) == 0) {
        local_a4 = RANDOMX_FLAG_DEFAULT;
        if ((local_19 & 1) != 0) {
          operator|=((randomx_flags *)in_stack_fffffffffffffbf0,
                     (randomx_flags)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
        }
        if ((local_1a & 1) != 0) {
          operator|=((randomx_flags *)in_stack_fffffffffffffbf0,
                     (randomx_flags)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
        }
        if ((local_11 & 1) == 0) {
          operator|=((randomx_flags *)in_stack_fffffffffffffbf0,
                     (randomx_flags)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
        }
        if ((local_16 & 1) != 0) {
          operator|=((randomx_flags *)in_stack_fffffffffffffbf0,
                     (randomx_flags)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
        }
      }
      else {
        local_28 = std::thread::hardware_concurrency();
        local_a4 = randomx_get_flags();
      }
      if ((local_15 & 1) != 0) {
        operator|=((randomx_flags *)in_stack_fffffffffffffbf0,
                   (randomx_flags)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
      }
      if ((local_12 & 1) != 0) {
        operator|=((randomx_flags *)in_stack_fffffffffffffbf0,
                   (randomx_flags)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
      }
      if ((local_17 & 1) != 0) {
        operator|=((randomx_flags *)in_stack_fffffffffffffbf0,
                   (randomx_flags)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
      }
      rVar1 = operator&(local_a4,RANDOMX_FLAG_ARGON2_AVX2);
      if (rVar1 == RANDOMX_FLAG_DEFAULT) {
        rVar1 = operator&(local_a4,RANDOMX_FLAG_ARGON2_SSSE3);
        if (rVar1 == RANDOMX_FLAG_DEFAULT) {
          poVar2 = std::operator<<((ostream *)&std::cout," - Argon2 implementation: reference");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout," - Argon2 implementation: SSSE3");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout," - Argon2 implementation: AVX2");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      rVar1 = operator&(local_a4,RANDOMX_FLAG_FULL_MEM);
      if (rVar1 == RANDOMX_FLAG_DEFAULT) {
        poVar2 = std::operator<<((ostream *)&std::cout," - light memory mode (256 MiB)");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout," - full memory mode (2080 MiB)");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      rVar1 = operator&(local_a4,RANDOMX_FLAG_JIT);
      if (rVar1 == RANDOMX_FLAG_DEFAULT) {
        poVar2 = std::operator<<((ostream *)&std::cout," - interpreted mode");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::operator<<((ostream *)&std::cout," - JIT compiled mode ");
        rVar1 = operator&(local_a4,RANDOMX_FLAG_SECURE);
        if (rVar1 != RANDOMX_FLAG_DEFAULT) {
          std::operator<<((ostream *)&std::cout,"(secure)");
        }
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      rVar1 = operator&(local_a4,RANDOMX_FLAG_HARD_AES);
      if (rVar1 == RANDOMX_FLAG_DEFAULT) {
        poVar2 = std::operator<<((ostream *)&std::cout," - software AES mode");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout," - hardware AES mode");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      rVar1 = operator&(local_a4,RANDOMX_FLAG_LARGE_PAGES);
      if (rVar1 == RANDOMX_FLAG_DEFAULT) {
        poVar2 = std::operator<<((ostream *)&std::cout," - small pages mode");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout," - large pages mode");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      if (local_30 != (Instruction)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cout," - thread affinity (");
        mask_to_string_abi_cxx11_(CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
        poVar2 = std::operator<<(poVar2,local_d8);
        poVar2 = std::operator<<(poVar2,")");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_d8);
      }
      if ((local_1c & 1) == 0) {
        if ((local_18 & 1) == 0) {
          poVar2 = std::operator<<((ostream *)&std::cout," - batch mode");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          local_e0 = (Instruction)mine<true,false>;
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout," - hash commitments");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          local_e0 = (Instruction)mine<false,true>;
        }
      }
      else if ((local_18 & 1) == 0) {
        local_e0 = (Instruction)mine<false,false>;
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout," - hash commitments");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_e0 = (Instruction)mine<false,true>;
      }
      std::operator<<((ostream *)&std::cout,"Initializing");
      if ((local_12 & 1) != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout," (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
        poVar2 = std::operator<<(poVar2," thread");
        pcVar13 = ")";
        if (1 < (int)local_28) {
          pcVar13 = "s)";
        }
        std::operator<<(poVar2,pcVar13);
      }
      poVar2 = std::operator<<((ostream *)&std::cout," ...");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      prVar3 = randomx::selectArgonImpl((randomx_flags)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
      if (prVar3 == (randomx_argon2_impl *)0x0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Unsupported Argon2 implementation");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      operator&(local_a4,RANDOMX_FLAG_JIT);
      rVar1 = operator&(local_a4,RANDOMX_FLAG_JIT);
      if (rVar1 == RANDOMX_FLAG_DEFAULT) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "WARNING: You are using the interpreter mode. Use --jit for optimal performance."
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      Stopwatch::Stopwatch
                ((Stopwatch *)in_stack_fffffffffffffbf0,
                 SUB81((ulong)in_stack_fffffffffffffbe8 >> 0x38,0));
      local_a0 = (Instruction)
                 randomx_alloc_cache((randomx_flags)((ulong)in_stack_fffffffffffffc68 >> 0x20));
      if (local_a0 == (Instruction)0x0) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = 0;
        CacheAllocException::CacheAllocException((CacheAllocException *)in_stack_fffffffffffffbf0);
        __cxa_throw(puVar5,&CacheAllocException::typeinfo,CacheAllocException::~CacheAllocException)
        ;
      }
      randomx_init_cache(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         (size_t)in_stack_fffffffffffffc20);
      if ((local_12 & 1) != 0) {
        local_98 = (Instruction)
                   randomx_alloc_dataset((randomx_flags)((ulong)in_stack_fffffffffffffc20 >> 0x20));
        if (local_98 == (Instruction)0x0) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = 0;
          DatasetAllocException::DatasetAllocException
                    ((DatasetAllocException *)in_stack_fffffffffffffbf0);
          __cxa_throw(puVar5,&DatasetAllocException::typeinfo,
                      DatasetAllocException::~DatasetAllocException);
        }
        uVar6 = randomx_dataset_item_count();
        local_fc = (uint)uVar6;
        if ((int)local_28 < 2) {
          randomx_init_dataset
                    (in_stack_fffffffffffffc00,
                     (randomx_cache *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                     (unsigned_long)in_stack_fffffffffffffbf0,
                     (unsigned_long)in_stack_fffffffffffffbe8);
        }
        else {
          local_100 = local_fc / local_28;
          local_104 = local_fc % local_28;
          local_108 = 0;
          for (local_10c = 0; (int)local_10c < (int)local_28; local_10c = local_10c + 1) {
            if (local_10c == local_28 - 1) {
              local_2c0 = local_104;
            }
            else {
              local_2c0 = 0;
            }
            local_110 = local_100 + local_2c0;
            local_120 = randomx_init_dataset;
            in_stack_fffffffffffffd44 = local_100;
            std::thread::
            thread<void(*)(randomx_dataset*,randomx_cache*,unsigned_long,unsigned_long),randomx_dataset*&,randomx_cache*&,unsigned_int&,unsigned_int&,void>
                      (in_stack_fffffffffffffc40,
                       (_func_void_randomx_dataset_ptr_randomx_cache_ptr_unsigned_long_unsigned_long
                        **)in_stack_fffffffffffffc38,(randomx_dataset **)in_stack_fffffffffffffc30,
                       in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18
                      );
            std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                      ((vector<std::thread,_std::allocator<std::thread>_> *)
                       in_stack_fffffffffffffbf0,(value_type *)in_stack_fffffffffffffbe8);
            std::thread::~thread((thread *)0x109772);
            local_108 = local_110 + local_108;
          }
          local_124 = 0;
          while( true ) {
            in_stack_fffffffffffffd38 = (randomx_cache *)(ulong)local_124;
            prVar7 = (randomx_cache *)
                     std::vector<std::thread,_std::allocator<std::thread>_>::size(&local_90);
            if (prVar7 <= in_stack_fffffffffffffd38) break;
            std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                      (&local_90,(ulong)local_124);
            std::thread::join();
            local_124 = local_124 + 1;
          }
        }
        randomx_release_cache(in_stack_fffffffffffffbf0);
        local_a0.opcode = '\0';
        local_a0.dst = '\0';
        local_a0.src = '\0';
        local_a0.mod = '\0';
        local_a0.imm32 = 0;
        std::vector<std::thread,_std::allocator<std::thread>_>::clear
                  ((vector<std::thread,_std::allocator<std::thread>_> *)0x10987f);
      }
      dataset_00 = (randomx_dataset *)
                   std::operator<<((ostream *)&std::cout,"Memory initialized in ");
      dVar14 = Stopwatch::getElapsed((Stopwatch *)0x1098a9);
      poVar2 = (ostream *)std::ostream::operator<<(dataset_00,dVar14);
      poVar2 = std::operator<<(poVar2," s");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"Initializing ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
      poVar2 = std::operator<<(poVar2," virtual machine(s) ...");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      for (local_128 = 0; local_128 < (int)local_24; local_128 = local_128 + 1) {
        local_130 = randomx_create_vm(in_stack_fffffffffffffd44,in_stack_fffffffffffffd38,dataset_00
                                     );
        if (local_130 == (randomx_vm *)0x0) {
          rVar1 = operator&(local_a4,RANDOMX_FLAG_HARD_AES);
          if (rVar1 != RANDOMX_FLAG_DEFAULT) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar4,"Cannot create VM with the selected options. Try using --softAes");
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if ((local_15 & 1) == 0) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Cannot create VM");
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar4,"Cannot create VM with the selected options. Try without --largePages");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::push_back
                  ((vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> *)in_stack_fffffffffffffc00,
                   (value_type *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"Running benchmark (");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
      poVar2 = std::operator<<(poVar2," nonces) ...");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Stopwatch::restart((Stopwatch *)in_stack_fffffffffffffbf0);
      if ((int)local_24 < 2) {
        uVar16 = 0;
        IVar17 = local_e0;
        pprVar10 = std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::operator[](local_78,0);
        prVar15 = *pprVar10;
        std::ref<std::atomic<unsigned_int>>((atomic<unsigned_int> *)in_stack_fffffffffffffbe8);
        paVar11 = std::reference_wrapper::operator_cast_to_atomic_
                            ((reference_wrapper<std::atomic<unsigned_int>_> *)0x109fb6);
        std::ref<AtomicHash>(in_stack_fffffffffffffbe8);
        pAVar12 = std::reference_wrapper::operator_cast_to_AtomicHash_
                            ((reference_wrapper<AtomicHash> *)0x109fdd);
        (*(code *)IVar17)(prVar15,paVar11,pAVar12,local_20,uVar16,0xffffffff);
      }
      else {
        for (local_138._4_4_ = 0; uVar8 = (ulong)(uint)local_138._4_4_,
            sVar9 = std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::size(local_78),
            uVar8 < sVar9; local_138._4_4_ = local_138._4_4_ + 1) {
          local_138._0_4_ = 0xffffffff;
          if (local_30 != (Instruction)0x0) {
            local_138._0_4_ = cpuid_from_mask((uint64_t)local_30,(uint *)(local_138 + 4));
          }
          std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::operator[]
                    (local_78,(ulong)(uint)local_138._4_4_);
          std::ref<std::atomic<unsigned_int>>((atomic<unsigned_int> *)in_stack_fffffffffffffbe8);
          std::ref<AtomicHash>(in_stack_fffffffffffffbe8);
          in_stack_fffffffffffffbf0 = (randomx_cache *)local_138;
          in_stack_fffffffffffffbe8 = (AtomicHash *)(local_138 + 4);
          std::thread::
          thread<void(*&)(randomx_vm*,std::atomic<unsigned_int>&,AtomicHash&,unsigned_int,int,int),randomx_vm*&,std::reference_wrapper<std::atomic<unsigned_int>>,std::reference_wrapper<AtomicHash>,int&,unsigned_int&,int&,void>
                    (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                     (randomx_vm **)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                     (reference_wrapper<AtomicHash> *)in_stack_fffffffffffffc30,
                     (int *)in_stack_fffffffffffffc28,
                     (uint *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                     in_stack_fffffffffffffc68);
          std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                    ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffbf0,
                     (value_type *)in_stack_fffffffffffffbe8);
          std::thread::~thread((thread *)0x109d44);
        }
        for (local_154 = 0;
            sVar9 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&local_90),
            local_154 < sVar9; local_154 = local_154 + 1) {
          std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                    (&local_90,(ulong)local_154);
          std::thread::join();
        }
      }
      dVar14 = Stopwatch::getElapsed((Stopwatch *)0x10a017);
      local_174 = 0;
      while( true ) {
        uVar8 = (ulong)local_174;
        sVar9 = std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::size(local_78);
        if (sVar9 <= uVar8) break;
        std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::operator[]
                  (local_78,(ulong)local_174);
        randomx_destroy_vm((randomx_vm *)in_stack_fffffffffffffbf0);
        local_174 = local_174 + 1;
      }
      if ((local_12 & 1) == 0) {
        randomx_release_cache(in_stack_fffffffffffffbf0);
      }
      else {
        randomx_release_dataset((randomx_dataset *)in_stack_fffffffffffffbf0);
      }
      std::operator<<((ostream *)&std::cout,"Calculated result: ");
      AtomicHash::print((AtomicHash *)in_stack_fffffffffffffc00,
                        (ostream *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      if (((local_20 == 1000) && (local_34 == 0)) && ((local_18 & 1) == 0)) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "Reference result:  2ef524aee58abcceeb488b28116f6d357411788ded7bdff2fed07002ce7ae987"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else if (((local_20 == 10) && (local_34 == 0)) && ((local_18 & 1) == 0)) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "Reference result:  8416fe0d17607f6ec811e7b7dfcf6cd384f7ef3cbfb9ff56ef906a918c9d9b0d"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      if ((local_12 & 1) == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Performance: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(dVar14 * 1000.0) / (double)local_20);
        poVar2 = std::operator<<(poVar2," ms per hash");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Performance: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)local_20 / dVar14);
        in_stack_fffffffffffffc00 = (randomx_dataset *)std::operator<<(poVar2," hashes per second");
        std::ostream::operator<<(in_stack_fffffffffffffc00,std::endl<char,std::char_traits<char>>);
      }
      local_4 = 0;
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc00);
      std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::~vector
                ((vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> *)in_stack_fffffffffffffc00);
    }
  }
  else {
    printUsage((char *)0x108b4b);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
	bool softAes, miningMode, verificationMode, help, largePages, jit, secure, commit;
	bool ssse3, avx2, autoFlags, noBatch;
	int noncesCount, threadCount, initThreadCount;
	uint64_t threadAffinity;
	int32_t seedValue;
	char seed[4];

	readOption("--softAes", argc, argv, softAes);
	readOption("--mine", argc, argv, miningMode);
	readOption("--verify", argc, argv, verificationMode);
	readIntOption("--threads", argc, argv, threadCount, 1);
	readUInt64Option("--affinity", argc, argv, threadAffinity, 0);
	readIntOption("--nonces", argc, argv, noncesCount, 1000);
	readIntOption("--init", argc, argv, initThreadCount, 1);
	readIntOption("--seed", argc, argv, seedValue, 0);
	readOption("--largePages", argc, argv, largePages);
	if (!largePages) {
		readOption("--largepages", argc, argv, largePages);
	}
	readOption("--jit", argc, argv, jit);
	readOption("--help", argc, argv, help);
	readOption("--secure", argc, argv, secure);
	readOption("--ssse3", argc, argv, ssse3);
	readOption("--avx2", argc, argv, avx2);
	readOption("--auto", argc, argv, autoFlags);
	readOption("--noBatch", argc, argv, noBatch);
	readOption("--commit", argc, argv, commit);

	store32(&seed, seedValue);

	std::cout << "RandomX benchmark v1.2.1" << std::endl;

	if (help) {
		printUsage(argv[0]);
		return 0;
	}

	if (!miningMode && !verificationMode) {
		std::cout << "Please select either the fast mode (--mine) or the slow mode (--verify)" << std::endl;
		std::cout << "Run '" << argv[0] << " --help' to see all supported options" << std::endl;
		return 0;
	}

	std::atomic<uint32_t> atomicNonce(0);
	AtomicHash result;
	std::vector<randomx_vm*> vms;
	std::vector<std::thread> threads;
	randomx_dataset* dataset;
	randomx_cache* cache;
	randomx_flags flags;

	if (autoFlags) {
		initThreadCount = std::thread::hardware_concurrency();
		flags = randomx_get_flags();
	}
	else {
		flags = RANDOMX_FLAG_DEFAULT;
		if (ssse3) {
			flags |= RANDOMX_FLAG_ARGON2_SSSE3;
		}
		if (avx2) {
			flags |= RANDOMX_FLAG_ARGON2_AVX2;
		}
		if (!softAes) {
			flags |= RANDOMX_FLAG_HARD_AES;
		}
		if (jit) {
			flags |= RANDOMX_FLAG_JIT;
#ifdef RANDOMX_FORCE_SECURE
			flags |= RANDOMX_FLAG_SECURE;
#endif
		}
	}

	if (largePages) {
		flags |= RANDOMX_FLAG_LARGE_PAGES;
	}
	if (miningMode) {
		flags |= RANDOMX_FLAG_FULL_MEM;
	}
#ifndef RANDOMX_FORCE_SECURE
	if (secure) {
		flags |= RANDOMX_FLAG_SECURE;
	}
#endif

	if (flags & RANDOMX_FLAG_ARGON2_AVX2) {
		std::cout << " - Argon2 implementation: AVX2" << std::endl;
	}
	else if (flags & RANDOMX_FLAG_ARGON2_SSSE3) {
		std::cout << " - Argon2 implementation: SSSE3" << std::endl;
	}
	else {
		std::cout << " - Argon2 implementation: reference" << std::endl;
	}

	if (flags & RANDOMX_FLAG_FULL_MEM) {
		std::cout << " - full memory mode (2080 MiB)" << std::endl;
	}
	else {
		std::cout << " - light memory mode (256 MiB)" << std::endl;
	}

	if (flags & RANDOMX_FLAG_JIT) {
		std::cout << " - JIT compiled mode ";
		if (flags & RANDOMX_FLAG_SECURE) {
			std::cout << "(secure)";
		}
		std::cout << std::endl;
	}
	else {
		std::cout << " - interpreted mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_HARD_AES) {
		std::cout << " - hardware AES mode" << std::endl;
	}
	else {
		std::cout << " - software AES mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_LARGE_PAGES) {
		std::cout << " - large pages mode" << std::endl;
	}
	else {
		std::cout << " - small pages mode" << std::endl;
	}

	if (threadAffinity) {
		std::cout << " - thread affinity (" << mask_to_string(threadAffinity) << ")" << std::endl;
	}

	MineFunc* func;

	if (noBatch) {
		if (commit) {
			std::cout << " - hash commitments" << std::endl;
			func = &mine<false, true>;
		}
		else {
			func = &mine<false, false>;
		}
	}
	else {
		if (commit) {
			//TODO: support batch mode with commitments
			std::cout << " - hash commitments" << std::endl;
			func = &mine<false, true>;
		}
		else {
			std::cout << " - batch mode" << std::endl;
			func = &mine<true, false>;
		}
	}

	std::cout << "Initializing";
	if (miningMode)
		std::cout << " (" << initThreadCount << " thread" << (initThreadCount > 1 ? "s)" : ")");
	std::cout << " ..." << std::endl;

	try {
		if (nullptr == randomx::selectArgonImpl(flags)) {
			throw std::runtime_error("Unsupported Argon2 implementation");
		}
		if ((flags & RANDOMX_FLAG_JIT) && !RANDOMX_HAVE_COMPILER) {
			throw std::runtime_error("JIT compilation is not supported on this platform. Try without --jit");
		}
		if (!(flags & RANDOMX_FLAG_JIT) && RANDOMX_HAVE_COMPILER) {
			std::cout << "WARNING: You are using the interpreter mode. Use --jit for optimal performance." << std::endl;
		}

		Stopwatch sw(true);
		cache = randomx_alloc_cache(flags);
		if (cache == nullptr) {
			throw CacheAllocException();
		}
		randomx_init_cache(cache, &seed, sizeof(seed));
		if (miningMode) {
			dataset = randomx_alloc_dataset(flags);
			if (dataset == nullptr) {
				throw DatasetAllocException();
			}
			uint32_t datasetItemCount = randomx_dataset_item_count();
			if (initThreadCount > 1) {
				auto perThread = datasetItemCount / initThreadCount;
				auto remainder = datasetItemCount % initThreadCount;
				uint32_t startItem = 0;
				for (int i = 0; i < initThreadCount; ++i) {
					auto count = perThread + (i == initThreadCount - 1 ? remainder : 0);
					threads.push_back(std::thread(&randomx_init_dataset, dataset, cache, startItem, count));
					startItem += count;
				}
				for (unsigned i = 0; i < threads.size(); ++i) {
					threads[i].join();
				}
			}
			else {
				randomx_init_dataset(dataset, cache, 0, datasetItemCount);
			}
			randomx_release_cache(cache);
			cache = nullptr;
			threads.clear();
		}
		std::cout << "Memory initialized in " << sw.getElapsed() << " s" << std::endl;
		std::cout << "Initializing " << threadCount << " virtual machine(s) ..." << std::endl;
		for (int i = 0; i < threadCount; ++i) {
			randomx_vm *vm = randomx_create_vm(flags, cache, dataset);
			if (vm == nullptr) {
				if ((flags & RANDOMX_FLAG_HARD_AES)) {
					throw std::runtime_error("Cannot create VM with the selected options. Try using --softAes");
				}
				if (largePages) {
					throw std::runtime_error("Cannot create VM with the selected options. Try without --largePages");
				}
				throw std::runtime_error("Cannot create VM");
			}
			vms.push_back(vm);
		}
		std::cout << "Running benchmark (" << noncesCount << " nonces) ..." << std::endl;
		sw.restart();
		if (threadCount > 1) {
			for (unsigned i = 0; i < vms.size(); ++i) {
				int cpuid = -1;
				if (threadAffinity)
					cpuid = cpuid_from_mask(threadAffinity, i);
				threads.push_back(std::thread(func, vms[i], std::ref(atomicNonce), std::ref(result), noncesCount, i, cpuid));
			}
			for (unsigned i = 0; i < threads.size(); ++i) {
				threads[i].join();
			}
		}
		else {
			func(vms[0], std::ref(atomicNonce), std::ref(result), noncesCount, 0, -1);
		}

		double elapsed = sw.getElapsed();
		for (unsigned i = 0; i < vms.size(); ++i)
			randomx_destroy_vm(vms[i]);
		if (miningMode)
			randomx_release_dataset(dataset);
		else
			randomx_release_cache(cache);
		std::cout << "Calculated result: ";
		result.print(std::cout);
		if (noncesCount == 1000 && seedValue == 0 && !commit)
			std::cout << "Reference result:  2ef524aee58abcceeb488b28116f6d357411788ded7bdff2fed07002ce7ae987" << std::endl;
		else if (noncesCount == 10 && seedValue == 0 && !commit)
			std::cout << "Reference result:  8416fe0d17607f6ec811e7b7dfcf6cd384f7ef3cbfb9ff56ef906a918c9d9b0d" << std::endl;
		if (!miningMode) {
			std::cout << "Performance: " << 1000 * elapsed / noncesCount << " ms per hash" << std::endl;
		}
		else {
			std::cout << "Performance: " << noncesCount / elapsed << " hashes per second" << std::endl;
		}
	}
	catch (MemoryException& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		if (largePages) {
#ifdef _WIN32
			std::cout << "To use large pages, please enable the \"Lock Pages in Memory\" policy and reboot." << std::endl;
			if (!IsWindows8OrGreater()) {
				std::cout << "Additionally, you have to run the benchmark from elevated command prompt." << std::endl;
			}
#else
			std::cout << "To use large pages, please run: sudo sysctl -w vm.nr_hugepages=1250" << std::endl;
#endif
		}
		return 1;
	}
	catch (std::exception& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		return 1;
	}
	return 0;
}